

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UICamera.cpp
# Opt level: O0

void UI::CameraMenuItems(shared_ptr<Camera> *camera)

{
  bool bVar1;
  element_type *this;
  undefined8 in_RDI;
  float in_stack_0000000c;
  float in_stack_00000010;
  float in_stack_00000014;
  undefined4 in_stack_00000018;
  float in_stack_0000001c;
  float in_stack_00000020;
  float in_stack_00000024;
  float *in_stack_00000028;
  char *in_stack_00000030;
  bool in_stack_00000147;
  char *in_stack_00000148;
  ImGuiSliderFlags flags;
  
  flags = (ImGuiSliderFlags)((ulong)in_RDI >> 0x20);
  bVar1 = ImGui::BeginMenu(in_stack_00000148,in_stack_00000147);
  if (bVar1) {
    std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x187d98);
    ImGui::DragAngle(in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000020,
                     in_stack_0000001c,(char *)CONCAT44(in_stack_00000014,in_stack_00000010),
                     (ImGuiSliderFlags)in_stack_0000000c);
    this = std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x187dd8);
    glm::vec<3,_float,_(glm::qualifier)0>::operator[](&this->m_position,0);
    ImGui::InputFloat3((char *)CONCAT44(in_stack_00000024,in_stack_00000020),
                       (float *)CONCAT44(in_stack_0000001c,in_stack_00000018),
                       (char *)CONCAT44(in_stack_00000014,in_stack_00000010),
                       (ImGuiInputTextFlags)in_stack_0000000c);
    std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x187e03);
    ImGui::DragAngle(in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000020,
                     in_stack_0000001c,(char *)CONCAT44(in_stack_00000014,in_stack_00000010),
                     (ImGuiSliderFlags)in_stack_0000000c);
    std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x187e3e);
    ImGui::DragAngle(in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000020,
                     in_stack_0000001c,(char *)CONCAT44(in_stack_00000014,in_stack_00000010),
                     (ImGuiSliderFlags)in_stack_0000000c);
    ImGui::Separator();
    std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x187e83);
    ImGui::DragFloat((char *)CONCAT44(in_stack_00000024,in_stack_00000020),
                     (float *)CONCAT44(in_stack_0000001c,in_stack_00000018),in_stack_00000014,
                     in_stack_00000010,in_stack_0000000c,(char *)camera,flags);
    std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x187ebb);
    ImGui::DragFloat((char *)CONCAT44(in_stack_00000024,in_stack_00000020),
                     (float *)CONCAT44(in_stack_0000001c,in_stack_00000018),in_stack_00000014,
                     in_stack_00000010,in_stack_0000000c,(char *)camera,flags);
    ImGui::EndMenu();
  }
  return;
}

Assistant:

void CameraMenuItems(const std::shared_ptr<Camera> &camera) {
	if (ImGui::BeginMenu("Camera")) {
		ImGui::DragAngle("FOV", &camera->m_fov, 1, 10, 179);
		ImGui::InputFloat3("Position", &camera->m_position[0]);
		ImGui::DragAngle("Yaw", &camera->m_yaw, 1, 0, 360);
		ImGui::DragAngle("Pitch", &camera->m_pitch, 1, -90, 90);
		ImGui::Separator();
		ImGui::DragFloat("Speed", &camera->m_speed, 0.005f, 0.005f, 0.2f);
		ImGui::DragFloat("Sensitivity", &camera->m_sensitivity, 0.001f, 0.001f, 0.02f);
		ImGui::EndMenu();
	}
}